

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::BrandedDecl(BrandedDecl *this,BrandedDecl *other)

{
  uint *puVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  StructDataBitCount SVar5;
  StructPointerCount SVar6;
  undefined2 uVar7;
  int iVar8;
  undefined4 uVar9;
  Refcounted *refcounted;
  Own<capnp::compiler::NodeTranslator::BrandScope> local_28;
  
  kj::
  OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
  ::copyFrom(&this->body,&other->body);
  (this->brand).disposer = (Disposer *)0x0;
  (this->brand).ptr = (BrandScope *)0x0;
  pCVar2 = (other->source)._reader.capTable;
  pvVar3 = (other->source)._reader.data;
  pWVar4 = (other->source)._reader.pointers;
  SVar5 = (other->source)._reader.dataSize;
  SVar6 = (other->source)._reader.pointerCount;
  uVar7 = *(undefined2 *)&(other->source)._reader.field_0x26;
  iVar8 = (other->source)._reader.nestingLimit;
  uVar9 = *(undefined4 *)&(other->source)._reader.field_0x2c;
  (this->source)._reader.segment = (other->source)._reader.segment;
  (this->source)._reader.capTable = pCVar2;
  (this->source)._reader.data = pvVar3;
  (this->source)._reader.pointers = pWVar4;
  (this->source)._reader.dataSize = SVar5;
  (this->source)._reader.pointerCount = SVar6;
  *(undefined2 *)&(this->source)._reader.field_0x26 = uVar7;
  (this->source)._reader.nestingLimit = iVar8;
  *(undefined4 *)&(this->source)._reader.field_0x2c = uVar9;
  if ((this->body).tag == 1) {
    local_28.disposer = (Disposer *)(other->brand).ptr;
    puVar1 = &(((BrandScope *)local_28.disposer)->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    local_28.ptr = (BrandScope *)local_28.disposer;
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator=(&this->brand,&local_28);
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::dispose(&local_28);
  }
  return;
}

Assistant:

NodeTranslator::BrandedDecl::BrandedDecl(BrandedDecl& other)
    : body(other.body),
      source(other.source) {
  if (body.is<Resolver::ResolvedDecl>()) {
    brand = kj::addRef(*other.brand);
  }
}